

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_table_scan.cpp
# Opt level: O3

SourceResultType __thiscall
duckdb::PhysicalTableScan::GetData
          (PhysicalTableScan *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  GlobalSourceState *pGVar1;
  table_function_t p_Var2;
  table_in_out_function_final_t p_Var3;
  OperatorResultType OVar4;
  SourceResultType SVar5;
  TableFunctionInput data;
  unique_lock<std::mutex> guard;
  TableFunctionInput local_58;
  unique_lock<std::mutex> local_40;
  
  pGVar1 = input->global_state;
  local_58.bind_data.ptr =
       (this->bind_data).
       super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
       super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  local_58.local_state.ptr = (LocalTableFunctionState *)input->local_state[1]._vptr_LocalSourceState
  ;
  local_58.global_state.ptr = *(GlobalTableFunctionState **)&pGVar1[1].super_StateWithBlockableTasks
  ;
  p_Var2 = (this->function).function;
  if (p_Var2 == (table_function_t)0x0) {
    if (pGVar1[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__size[0] == '\x01'
       ) {
      (*(this->function).in_out_function_final)(context,&local_58,chunk);
    }
    OVar4 = (*(this->function).in_out_function)
                      (context,&local_58,
                       (DataChunk *)
                       ((long)&pGVar1[1].super_StateWithBlockableTasks.lock.super___mutex_base.
                               _M_mutex + 8),chunk);
    if (OVar4 == BLOCKED) {
      local_40._M_device = &(pGVar1->super_StateWithBlockableTasks).lock;
      local_40._M_owns = false;
      ::std::unique_lock<std::mutex>::lock(&local_40);
      local_40._M_owns = true;
      SVar5 = FINISHED;
      if (((pGVar1->super_StateWithBlockableTasks).can_block._M_base._M_i & 1U) != 0) {
        SVar5 = BLOCKED;
        ::std::vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>::push_back
                  (&(pGVar1->super_StateWithBlockableTasks).blocked_tasks.
                    super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>,
                   input->interrupt_state);
      }
      ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
      return SVar5;
    }
    if (chunk->count != 0) {
      return HAVE_MORE_OUTPUT;
    }
    p_Var3 = (this->function).in_out_function_final;
    if (p_Var3 == (table_in_out_function_final_t)0x0) {
      return FINISHED;
    }
    (*p_Var3)(context,&local_58,chunk);
    pGVar1[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__size[0] = '\x01';
  }
  else {
    (*p_Var2)(context->client,&local_58,chunk);
  }
  return chunk->count == 0;
}

Assistant:

SourceResultType PhysicalTableScan::GetData(ExecutionContext &context, DataChunk &chunk,
                                            OperatorSourceInput &input) const {
	D_ASSERT(!column_ids.empty());
	auto &g_state = input.global_state.Cast<TableScanGlobalSourceState>();
	auto &l_state = input.local_state.Cast<TableScanLocalSourceState>();

	TableFunctionInput data(bind_data.get(), l_state.local_state.get(), g_state.global_state.get());

	if (function.function) {
		function.function(context.client, data, chunk);
		return chunk.size() == 0 ? SourceResultType::FINISHED : SourceResultType::HAVE_MORE_OUTPUT;
	}

	if (g_state.in_out_final) {
		function.in_out_function_final(context, data, chunk);
	}
	switch (function.in_out_function(context, data, g_state.input_chunk, chunk)) {
	case OperatorResultType::BLOCKED: {
		auto guard = g_state.Lock();
		return g_state.BlockSource(guard, input.interrupt_state);
	}
	default:
		// FIXME: Handling for other cases (such as NEED_MORE_INPUT) breaks current functionality and extensions that
		// might be relying on current behaviour. Needs a rework that is not in scope
		break;
	}

	if (chunk.size() == 0 && function.in_out_function_final) {
		function.in_out_function_final(context, data, chunk);
		g_state.in_out_final = true;
	}
	return chunk.size() == 0 ? SourceResultType::FINISHED : SourceResultType::HAVE_MORE_OUTPUT;
}